

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool mjs::operator==(token *l,token *r)

{
  bool bVar1;
  token_type tVar2;
  token_type tVar3;
  wstring *__lhs;
  wstring *__rhs;
  double dVar4;
  double dVar5;
  token *r_local;
  token *l_local;
  
  tVar2 = token::type(l);
  tVar3 = token::type(r);
  if (tVar2 == tVar3) {
    bVar1 = token::has_text(l);
    if (bVar1) {
      __lhs = token::text_abi_cxx11_(l);
      __rhs = token::text_abi_cxx11_(r);
      l_local._7_1_ = std::operator==(__lhs,__rhs);
    }
    else {
      tVar2 = token::type(l);
      if (tVar2 == numeric_literal) {
        dVar4 = token::dvalue(l);
        dVar5 = token::dvalue(r);
        l_local._7_1_ = dVar4 == dVar5;
      }
      else {
        l_local._7_1_ = true;
      }
    }
  }
  else {
    l_local._7_1_ = false;
  }
  return l_local._7_1_;
}

Assistant:

bool operator==(const token& l, const token& r) {
    if (l.type() != r.type()) {
        return false;
    } else if (l.has_text()) {
        return l.text() == r.text();
    } else if (l.type() == token_type::numeric_literal) {
        return l.dvalue() == r.dvalue();
    }
    return true;
}